

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O0

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::actOnDefaultDecl
          (ManifestLoaderImpl *this,ArrayRef<llbuild::ninja::Token> nameToks)

{
  StringRef path0;
  iterator pTVar1;
  pointer pMVar2;
  size_t sVar3;
  vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *this_00;
  Node *local_80;
  Node *node;
  StringRef name;
  Token *nameTok;
  iterator __end1;
  iterator __begin1;
  ArrayRef<llbuild::ninja::Token> *__range1;
  ManifestLoaderImpl *this_local;
  ArrayRef<llbuild::ninja::Token> nameToks_local;
  
  nameToks_local.Data = (Token *)nameToks.Length;
  this_local = (ManifestLoaderImpl *)nameToks.Data;
  __end1 = llvm::ArrayRef<llbuild::ninja::Token>::begin
                     ((ArrayRef<llbuild::ninja::Token> *)&this_local);
  pTVar1 = llvm::ArrayRef<llbuild::ninja::Token>::end
                     ((ArrayRef<llbuild::ninja::Token> *)&this_local);
  for (; __end1 != pTVar1; __end1 = __end1 + 1) {
    name.Length = (size_t)__end1;
    node = (Node *)__end1->start;
    name.Data = (char *)(ulong)__end1->length;
    nameToks_local.Length = (size_type)name.Data;
    pMVar2 = std::
             unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>::
             operator->(&this->manifest);
    path0.Length = (size_t)name.Data;
    path0.Data = (char *)node;
    local_80 = Manifest::findNode(pMVar2,this->workingDirectory,path0);
    if (local_80 == (Node *)0x0) {
      sVar3 = strlen("unknown target name");
      (*(this->super_ParseActions)._vptr_ParseActions[2])
                (this,"unknown target name",sVar3,name.Length);
    }
    else {
      pMVar2 = std::
               unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
               ::operator->(&this->manifest);
      this_00 = Manifest::getDefaultTargets(pMVar2);
      std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::push_back
                (this_00,&local_80);
    }
  }
  return;
}

Assistant:

virtual void actOnDefaultDecl(ArrayRef<Token> nameToks) override {
    // Resolve all of the inputs and outputs.
    for (const auto& nameTok: nameToks) {
      StringRef name(nameTok.start, nameTok.length);
      Node* node = manifest->findNode(workingDirectory, name);

      if (node == nullptr) {
        error("unknown target name", nameTok);
        continue;
      }

      manifest->getDefaultTargets().push_back(node);
    }
  }